

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

double sawWave(double x)

{
  double dVar1;
  
  if (0.0 <= x) {
    dVar1 = floor(x);
    dVar1 = x - dVar1;
  }
  else {
    dVar1 = floor(ABS(x));
    dVar1 = x + dVar1 + 1.0;
  }
  dVar1 = (double)(-(ulong)(dVar1 < 0.5) & (ulong)dVar1 |
                  ~-(ulong)(dVar1 < 0.5) & (ulong)(1.0 - dVar1));
  return dVar1 + dVar1;
}

Assistant:

double sawWave(double x)
{
   double offset, temp1;

   if(x >= 0.0) offset = frac(x);
   else
   {
      temp1  = -1.0 - floor(fabs(x));
      offset = x - temp1;
   }
   if(offset >= 0.5) return 2.0 * (1.0 -  offset);
   else              return 2.0 * offset;
}